

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O1

void __thiscall CMU462::StaticScene::Mesh::Mesh(Mesh *this,HalfedgeMesh *mesh,BSDF *bsdf)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  undefined8 *puVar1;
  unsigned_long *puVar2;
  list<CMU462::Face,_std::allocator<CMU462::Face>_> *plVar3;
  long lVar4;
  iterator iVar5;
  HalfedgeMesh *pHVar6;
  undefined1 auVar7 [16];
  undefined8 uVar8;
  HalfedgeMesh *pHVar9;
  _List_node_base *p_Var10;
  mapped_type *pmVar11;
  Vector3D *pVVar12;
  bool bVar13;
  _Self __tmp_1;
  long lVar14;
  _List_node_base *p_Var15;
  ulong uVar16;
  _Self __tmp;
  ulong uVar17;
  Vertex *v;
  vector<const_CMU462::Vertex_*,_std::allocator<const_CMU462::Vertex_*>_> verts;
  HalfedgeMesh _mesh;
  unordered_map<const_CMU462::Vertex_*,_int,_std::hash<const_CMU462::Vertex_*>,_std::equal_to<const_CMU462::Vertex_*>,_std::allocator<std::pair<const_CMU462::Vertex_*const,_int>_>_>
  vertexLabels;
  key_type local_128;
  Vector3D local_120;
  void *local_108;
  iterator iStack_100;
  Vertex **local_f8;
  BSDF *local_e8;
  HalfedgeMesh local_e0;
  _Hashtable<const_CMU462::Vertex_*,_std::pair<const_CMU462::Vertex_*const,_int>,_std::allocator<std::pair<const_CMU462::Vertex_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<const_CMU462::Vertex_*>,_std::hash<const_CMU462::Vertex_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  (this->super_SceneObject)._vptr_SceneObject = (_func_int **)&PTR_get_primitives_00271a68;
  this_00 = &this->indices;
  (this->indices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->indices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->indices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  HalfedgeMesh::HalfedgeMesh(&local_e0,mesh);
  p_Var10 = (mesh->faces).super__List_base<CMU462::Face,_std::allocator<CMU462::Face>_>._M_impl.
            _M_node.super__List_node_base._M_next;
  if (p_Var10 != (_List_node_base *)&mesh->faces) {
    bVar13 = false;
    do {
      lVar14 = 3;
      p_Var15 = p_Var10[0xb]._M_prev;
      do {
        p_Var15 = p_Var15[2]._M_next;
        lVar14 = lVar14 + -1;
      } while (p_Var10[0xb]._M_prev != p_Var15);
      if (lVar14 != 0) {
        bVar13 = true;
      }
      p_Var10 = p_Var10->_M_next;
    } while (p_Var10 != (_List_node_base *)&mesh->faces);
    if (bVar13) {
      HalfedgeMesh::triangulate(&local_e0);
    }
  }
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  local_108 = (void *)0x0;
  iStack_100._M_current = (Vertex **)0x0;
  local_f8 = (Vertex **)0x0;
  uVar16 = 0;
  local_e8 = bsdf;
  if (local_e0.vertices.super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>._M_impl.
      _M_node.super__List_node_base._M_next != (_List_node_base *)&local_e0.vertices) {
    p_Var10 = local_e0.vertices.super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>.
              _M_impl._M_node.super__List_node_base._M_next;
    do {
      local_120.x = (double)(p_Var10 + 1);
      if (iStack_100._M_current == local_f8) {
        std::vector<CMU462::Vertex_const*,std::allocator<CMU462::Vertex_const*>>::
        _M_realloc_insert<CMU462::Vertex_const*const&>
                  ((vector<CMU462::Vertex_const*,std::allocator<CMU462::Vertex_const*>> *)&local_108
                   ,iStack_100,(Vertex **)&local_120);
      }
      else {
        *iStack_100._M_current = (Vertex *)local_120.x;
        iStack_100._M_current = iStack_100._M_current + 1;
      }
      pmVar11 = std::__detail::
                _Map_base<const_CMU462::Vertex_*,_std::pair<const_CMU462::Vertex_*const,_int>,_std::allocator<std::pair<const_CMU462::Vertex_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<const_CMU462::Vertex_*>,_std::hash<const_CMU462::Vertex_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<const_CMU462::Vertex_*,_std::pair<const_CMU462::Vertex_*const,_int>,_std::allocator<std::pair<const_CMU462::Vertex_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<const_CMU462::Vertex_*>,_std::hash<const_CMU462::Vertex_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&local_68,(key_type *)&local_120);
      *pmVar11 = (mapped_type)uVar16;
      uVar16 = uVar16 + 1;
      p_Var10 = p_Var10->_M_next;
    } while (p_Var10 != (_List_node_base *)&local_e0.vertices);
  }
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar16;
  uVar17 = 0xffffffffffffffff;
  if (SUB168(auVar7 * ZEXT816(0x18),8) == 0) {
    uVar17 = SUB168(auVar7 * ZEXT816(0x18),0);
  }
  pVVar12 = (Vector3D *)operator_new__(uVar17);
  if (uVar16 != 0) {
    memset(pVVar12,0,((uVar16 * 0x18 - 0x18) / 0x18) * 0x18 + 0x18);
  }
  this->positions = pVVar12;
  pVVar12 = (Vector3D *)operator_new__(uVar17);
  if (uVar16 != 0) {
    memset(pVVar12,0,((uVar16 * 0x18 - 0x18) / 0x18) * 0x18 + 0x18);
  }
  this->normals = pVVar12;
  if (uVar16 != 0) {
    lVar14 = 0;
    uVar17 = 0;
    do {
      lVar4 = *(long *)((long)local_108 + uVar17 * 8);
      pVVar12 = this->positions;
      *(undefined8 *)((long)&pVVar12->z + lVar14) = *(undefined8 *)(lVar4 + 0x18);
      uVar8 = *(undefined8 *)(lVar4 + 0x10);
      puVar1 = (undefined8 *)((long)&pVVar12->x + lVar14);
      *puVar1 = *(undefined8 *)(lVar4 + 8);
      puVar1[1] = uVar8;
      Vertex::normal(&local_120,*(Vertex **)((long)local_108 + uVar17 * 8));
      pVVar12 = this->normals;
      *(double *)((long)&pVVar12->z + lVar14) = local_120.z;
      puVar2 = (unsigned_long *)((long)&pVVar12->x + lVar14);
      *puVar2 = (unsigned_long)local_120.x;
      puVar2[1] = (unsigned_long)local_120.y;
      uVar17 = uVar17 + 1;
      lVar14 = lVar14 + 0x18;
    } while (uVar16 != uVar17);
  }
  plVar3 = &local_e0.faces;
  if (local_e0.faces.super__List_base<CMU462::Face,_std::allocator<CMU462::Face>_>._M_impl._M_node.
      super__List_node_base._M_next != (_List_node_base *)plVar3) {
    p_Var10 = local_e0.faces.super__List_base<CMU462::Face,_std::allocator<CMU462::Face>_>._M_impl.
              _M_node.super__List_node_base._M_next;
    do {
      p_Var15 = p_Var10[0xb]._M_prev;
      local_128 = (key_type)(p_Var15[2]._M_prev + 1);
      pmVar11 = std::__detail::
                _Map_base<const_CMU462::Vertex_*,_std::pair<const_CMU462::Vertex_*const,_int>,_std::allocator<std::pair<const_CMU462::Vertex_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<const_CMU462::Vertex_*>,_std::hash<const_CMU462::Vertex_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<const_CMU462::Vertex_*,_std::pair<const_CMU462::Vertex_*const,_int>,_std::allocator<std::pair<const_CMU462::Vertex_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<const_CMU462::Vertex_*>,_std::hash<const_CMU462::Vertex_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&local_68,&local_128);
      local_120.x = (double)(long)*pmVar11;
      iVar5._M_current =
           (this->indices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (this->indices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                  (this_00,iVar5,(unsigned_long *)&local_120);
      }
      else {
        *iVar5._M_current = (unsigned_long)local_120.x;
        (this->indices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar5._M_current + 1;
      }
      local_128 = (key_type)(p_Var15[2]._M_next[2]._M_prev + 1);
      pmVar11 = std::__detail::
                _Map_base<const_CMU462::Vertex_*,_std::pair<const_CMU462::Vertex_*const,_int>,_std::allocator<std::pair<const_CMU462::Vertex_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<const_CMU462::Vertex_*>,_std::hash<const_CMU462::Vertex_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<const_CMU462::Vertex_*,_std::pair<const_CMU462::Vertex_*const,_int>,_std::allocator<std::pair<const_CMU462::Vertex_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<const_CMU462::Vertex_*>,_std::hash<const_CMU462::Vertex_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&local_68,&local_128);
      local_120.x = (double)(long)*pmVar11;
      iVar5._M_current =
           (this->indices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (this->indices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                  (this_00,iVar5,(unsigned_long *)&local_120);
      }
      else {
        *iVar5._M_current = (unsigned_long)local_120.x;
        (this->indices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar5._M_current + 1;
      }
      local_128 = (key_type)(p_Var15[2]._M_next[2]._M_next[2]._M_prev + 1);
      pmVar11 = std::__detail::
                _Map_base<const_CMU462::Vertex_*,_std::pair<const_CMU462::Vertex_*const,_int>,_std::allocator<std::pair<const_CMU462::Vertex_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<const_CMU462::Vertex_*>,_std::hash<const_CMU462::Vertex_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<const_CMU462::Vertex_*,_std::pair<const_CMU462::Vertex_*const,_int>,_std::allocator<std::pair<const_CMU462::Vertex_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<const_CMU462::Vertex_*>,_std::hash<const_CMU462::Vertex_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&local_68,&local_128);
      local_120.x = (double)(long)*pmVar11;
      iVar5._M_current =
           (this->indices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (this->indices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                  (this_00,iVar5,(unsigned_long *)&local_120);
      }
      else {
        *iVar5._M_current = (unsigned_long)local_120.x;
        (this->indices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar5._M_current + 1;
      }
      p_Var10 = p_Var10->_M_next;
    } while (p_Var10 != (_List_node_base *)plVar3);
  }
  this->bsdf = local_e8;
  if (local_108 != (void *)0x0) {
    operator_delete(local_108);
  }
  std::
  _Hashtable<const_CMU462::Vertex_*,_std::pair<const_CMU462::Vertex_*const,_int>,_std::allocator<std::pair<const_CMU462::Vertex_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<const_CMU462::Vertex_*>,_std::hash<const_CMU462::Vertex_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_68);
  while (p_Var10 = local_e0.faces.super__List_base<CMU462::Face,_std::allocator<CMU462::Face>_>.
                   _M_impl._M_node.super__List_node_base._M_next,
        local_e0.boundaries.super__List_base<CMU462::Face,_std::allocator<CMU462::Face>_>._M_impl.
        _M_node.super__List_node_base._M_next != (_List_node_base *)&local_e0.boundaries) {
    p_Var10 = (local_e0.boundaries.super__List_base<CMU462::Face,_std::allocator<CMU462::Face>_>.
               _M_impl._M_node.super__List_node_base._M_next)->_M_next;
    (*(code *)local_e0.boundaries.super__List_base<CMU462::Face,_std::allocator<CMU462::Face>_>.
              _M_impl._M_node.super__List_node_base._M_next[1]._M_next[2]._M_prev)
              (local_e0.boundaries.super__List_base<CMU462::Face,_std::allocator<CMU462::Face>_>.
               _M_impl._M_node.super__List_node_base._M_next + 1);
    operator_delete(local_e0.boundaries.
                    super__List_base<CMU462::Face,_std::allocator<CMU462::Face>_>._M_impl._M_node.
                    super__List_node_base._M_next);
    local_e0.boundaries.super__List_base<CMU462::Face,_std::allocator<CMU462::Face>_>._M_impl.
    _M_node.super__List_node_base._M_next = p_Var10;
  }
  while (p_Var10 != (_List_node_base *)plVar3) {
    p_Var15 = p_Var10->_M_next;
    (*(code *)p_Var10[1]._M_next[2]._M_prev)(p_Var10 + 1);
    operator_delete(p_Var10);
    p_Var10 = p_Var15;
  }
  p_Var10 = local_e0.edges.super__List_base<CMU462::Edge,_std::allocator<CMU462::Edge>_>._M_impl.
            _M_node.super__List_node_base._M_next;
  while (p_Var10 != (_List_node_base *)&local_e0.edges) {
    p_Var15 = p_Var10->_M_next;
    (*(code *)p_Var10[1]._M_next[2]._M_prev)(p_Var10 + 1);
    operator_delete(p_Var10);
    p_Var10 = p_Var15;
  }
  p_Var10 = local_e0.vertices.super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>.
            _M_impl._M_node.super__List_node_base._M_next;
  while (pHVar9 = (HalfedgeMesh *)
                  local_e0.halfedges.
                  super__List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>._M_impl.
                  _M_node.super__List_node_base._M_next,
        p_Var10 != (_List_node_base *)&local_e0.vertices) {
    p_Var15 = p_Var10->_M_next;
    (*(code *)p_Var10[1]._M_next[2]._M_prev)(p_Var10 + 1);
    operator_delete(p_Var10);
    p_Var10 = p_Var15;
  }
  while (pHVar9 != &local_e0) {
    pHVar6 = (HalfedgeMesh *)
             (pHVar9->halfedges).
             super__List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>._M_impl._M_node.
             super__List_node_base._M_next;
    (**(code **)((pHVar9->halfedges).
                 super__List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>._M_impl.
                 _M_node._M_size + 0x28))
              (&(pHVar9->halfedges).
                super__List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>._M_impl.
                _M_node._M_size);
    operator_delete(pHVar9);
    pHVar9 = pHVar6;
  }
  return;
}

Assistant:

Mesh::Mesh(const HalfedgeMesh& mesh, BSDF* bsdf) {
  // triangulate mesh before sending to visualization or render mode
  HalfedgeMesh _mesh(mesh);

  // Triangulate if needed
  bool triNeeded = false;
  for (auto f = mesh.facesBegin(); f != mesh.facesEnd(); f++) {
    if(f->degree() != 3) {
      triNeeded = true;
    }
  }
  if(triNeeded) {
    _mesh.triangulate();
  }

  unordered_map<const Vertex*, int> vertexLabels;
  vector<const Vertex*> verts;

  size_t vertexI = 0;
  for (VertexCIter it = _mesh.verticesBegin(); it != _mesh.verticesEnd();
       it++) {
    const Vertex* v = &*it;
    verts.push_back(v);
    vertexLabels[v] = vertexI;
    vertexI++;
  }

  positions = new Vector3D[vertexI];
  normals = new Vector3D[vertexI];
  for (int i = 0; i < vertexI; i++) {
    positions[i] = verts[i]->position;
    normals[i] = verts[i]->normal();
  }

  for (FaceCIter f = _mesh.facesBegin(); f != _mesh.facesEnd(); f++) {
    HalfedgeCIter h = f->halfedge();
    indices.push_back(vertexLabels[&*h->vertex()]);
    indices.push_back(vertexLabels[&*h->next()->vertex()]);
    indices.push_back(vertexLabels[&*h->next()->next()->vertex()]);
  }

  this->bsdf = bsdf;
}